

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::Reflection::RemoveLast(Reflection *this,Message *message,FieldDescriptor *field)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  undefined8 *puVar4;
  bool bVar5;
  uint32 uVar6;
  RepeatedPtrFieldBase *pRVar7;
  ulong uVar8;
  MapFieldBase *this_00;
  Arena *pAVar9;
  FieldDescriptor *local_30;
  _func_void_FieldDescriptor_ptr *local_28;
  
  if (*(Descriptor **)(field + 0x50) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"RemoveLast","Field does not match message type.");
  }
  if (*(int *)(field + 0x3c) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"RemoveLast",
               "Field is singular; the method requires a repeated field.");
  }
  if (field[0x42] != (FieldDescriptor)0x1) {
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_28 = FieldDescriptor::TypeOnceInit;
      local_30 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),&local_28,&local_30);
    }
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4))
    {
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
      uVar6 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      piVar1 = (int *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar6);
      *piVar1 = *piVar1 + -1;
      break;
    case 9:
      uVar6 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar8 = (ulong)uVar6;
      lVar3 = *(long *)((long)&message[2].super_MessageLite._vptr_MessageLite + uVar8);
      iVar2 = *(int *)((long)&message[1].super_MessageLite._vptr_MessageLite + uVar8);
      *(int *)((long)&message[1].super_MessageLite._vptr_MessageLite + uVar8) = iVar2 + -1;
      puVar4 = *(undefined8 **)(lVar3 + (long)iVar2 * 8);
      puVar4[1] = 0;
      *(undefined1 *)*puVar4 = 0;
      break;
    case 10:
      bVar5 = anon_unknown_0::IsMapFieldInApi(field);
      uVar6 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      this_00 = (MapFieldBase *)
                ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar6);
      if (bVar5) {
        pRVar7 = internal::MapFieldBase::MutableRepeatedField(this_00);
        iVar2 = pRVar7->current_size_;
        pRVar7->current_size_ = iVar2 + -1;
        pAVar9 = (Arena *)pRVar7->rep_->elements[(long)iVar2 + -1];
      }
      else {
        iVar2 = *(int *)&this_00->arena_;
        *(int *)&this_00->arena_ = iVar2 + -1;
        pAVar9 = (&(this_00->repeated_field_->super_RepeatedPtrFieldBase).arena_)[iVar2];
      }
      (*(code *)((pAVar9->impl_).threads_._M_b._M_p)->cleanup_ptr_)();
    }
    return;
  }
  internal::ExtensionSet::RemoveLast
            ((ExtensionSet *)
             ((long)&(message->super_MessageLite)._vptr_MessageLite +
             (ulong)(uint)(this->schema_).extensions_offset_),*(int *)(field + 0x44));
  return;
}

Assistant:

void Reflection::RemoveLast(Message* message,
                            const FieldDescriptor* field) const {
  USAGE_CHECK_MESSAGE_TYPE(RemoveLast);
  USAGE_CHECK_REPEATED(RemoveLast);

  if (field->is_extension()) {
    MutableExtensionSet(message)->RemoveLast(field->number());
  } else {
    switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                                \
  case FieldDescriptor::CPPTYPE_##UPPERCASE:                             \
    MutableRaw<RepeatedField<LOWERCASE> >(message, field)->RemoveLast(); \
    break

      HANDLE_TYPE(INT32, int32);
      HANDLE_TYPE(INT64, int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, int);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_STRING:
        switch (field->options().ctype()) {
          default:  // TODO(kenton):  Support other string reps.
          case FieldOptions::STRING:
            MutableRaw<RepeatedPtrField<std::string> >(message, field)
                ->RemoveLast();
            break;
        }
        break;

      case FieldDescriptor::CPPTYPE_MESSAGE:
        if (IsMapFieldInApi(field)) {
          MutableRaw<MapFieldBase>(message, field)
              ->MutableRepeatedField()
              ->RemoveLast<GenericTypeHandler<Message> >();
        } else {
          MutableRaw<RepeatedPtrFieldBase>(message, field)
              ->RemoveLast<GenericTypeHandler<Message> >();
        }
        break;
    }
  }
}